

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

void __thiscall Centaurus::CATNNode<wchar_t>::CATNNode(CATNNode<wchar_t> *this,Identifier *id)

{
  Identifier *id_local;
  CATNNode<wchar_t> *this_local;
  
  this->_vptr_CATNNode = (_func_int **)&PTR__CATNNode_00285530;
  std::
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>::
  vector(&this->m_transitions);
  Identifier::Identifier(&this->m_submachine,id);
  this->m_source = -1;
  return;
}

Assistant:

CATNNode(const Identifier& id)
        : m_submachine(id), m_source(-1)
    {
    }